

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::Compare
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  UnknownFieldSet *unknown_field_set1;
  UnknownFieldSet *unknown_field_set2;
  Message *message2_00;
  Descriptor *unaff_RBP;
  Metadata MVar5;
  Metadata MVar6;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message2_fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  message1_fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_70;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_58;
  Message *local_40;
  ulong local_38;
  
  bVar2 = (byte)unaff_RBP;
  MVar5 = Message::GetMetadata(message1);
  iVar4 = std::__cxx11::string::compare((char *)((MVar5.descriptor)->all_names_ + 1));
  if (iVar4 == 0) {
    local_58.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_70.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bVar1 = UnpackAnyField::UnpackAny
                      (&this->unpack_any_field_,message1,
                       (unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                        *)&local_58);
    local_38 = (ulong)(uint)unpacked_any;
    if (bVar1) {
      bVar1 = UnpackAnyField::UnpackAny
                        (&this->unpack_any_field_,message2,
                         (unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                          *)&local_70);
      message2_00 = (Message *)
                    local_70.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if (bVar1) {
        local_40 = (Message *)
                   local_58.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        MVar5 = Message::GetMetadata
                          ((Message *)
                           local_58.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        message2_00 = (Message *)
                      local_70.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        unaff_RBP = MVar5.descriptor;
        MVar5 = Message::GetMetadata
                          ((Message *)
                           local_70.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        if (unaff_RBP != MVar5.descriptor) goto LAB_00310826;
        bVar2 = Compare(this,local_40,message2_00,unpacked_any + 1,parent_fields);
        bVar1 = true;
      }
      else {
LAB_00310826:
        bVar2 = (byte)unaff_RBP;
        bVar1 = false;
      }
      if (message2_00 != (Message *)0x0) {
        (*(message2_00->super_MessageLite)._vptr_MessageLite[1])(message2_00);
      }
    }
    else {
      bVar1 = false;
    }
    if ((Message *)
        local_58.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (Message *)0x0) {
      (*((MessageLite *)
        local_58.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start)->_vptr_MessageLite[1])();
    }
    unpacked_any = (int)local_38;
    if (bVar1) goto LAB_00310942;
  }
  bVar1 = true;
  if (this->message_field_comparison_ != EQUIVALENT) {
    MVar5 = Message::GetMetadata(message1);
    MVar6 = Message::GetMetadata(message2);
    unknown_field_set1 = Reflection::GetUnknownFields(MVar5.reflection,message1);
    unknown_field_set2 = Reflection::GetUnknownFields(MVar6.reflection,message2);
    bVar1 = CompareUnknownFields
                      (this,message1,message2,unknown_field_set1,unknown_field_set2,parent_fields);
    if ((!bVar1) && (this->reporter_ == (Reporter *)0x0)) {
      bVar2 = 0;
      goto LAB_00310942;
    }
  }
  RetrieveFields(&local_58,this,message1,true);
  RetrieveFields(&local_70,this,message2,false);
  bVar3 = CompareRequestedFieldsUsingSettings
                    (this,message1,message2,unpacked_any,&local_58,&local_70,parent_fields);
  if ((Message *)
      local_70.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (Message *)0x0) {
    operator_delete(local_70.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((Message *)
      local_58.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (Message *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  bVar2 = bVar1 & bVar3;
LAB_00310942:
  return (bool)(bVar2 & 1);
}

Assistant:

bool MessageDifferencer::Compare(const Message& message1,
                                 const Message& message2, int unpacked_any,
                                 std::vector<SpecificField>* parent_fields) {
  // Expand google.protobuf.Any payload if possible.
  if (message1.GetDescriptor()->full_name() == internal::kAnyFullTypeName) {
    std::unique_ptr<Message> data1;
    std::unique_ptr<Message> data2;
    if (unpack_any_field_.UnpackAny(message1, &data1) &&
        unpack_any_field_.UnpackAny(message2, &data2) &&
        data1->GetDescriptor() == data2->GetDescriptor()) {
      return Compare(*data1, *data2, unpacked_any + 1, parent_fields);
    }
    // If the Any payload is unparsable, or the payload types are different
    // between message1 and message2, fall through and treat Any as a regular
    // proto.
  }

  bool unknown_compare_result = true;
  // Ignore unknown fields in EQUIVALENT mode
  if (message_field_comparison_ != EQUIVALENT) {
    const Reflection* reflection1 = message1.GetReflection();
    const Reflection* reflection2 = message2.GetReflection();
    const UnknownFieldSet& unknown_field_set1 =
        reflection1->GetUnknownFields(message1);
    const UnknownFieldSet& unknown_field_set2 =
        reflection2->GetUnknownFields(message2);
    if (!CompareUnknownFields(message1, message2, unknown_field_set1,
                              unknown_field_set2, parent_fields)) {
      if (reporter_ == NULL) {
        return false;
      }
      unknown_compare_result = false;
    }
  }

  std::vector<const FieldDescriptor*> message1_fields =
      RetrieveFields(message1, true);
  std::vector<const FieldDescriptor*> message2_fields =
      RetrieveFields(message2, false);

  return CompareRequestedFieldsUsingSettings(message1, message2, unpacked_any,
                                             message1_fields, message2_fields,
                                             parent_fields) &&
         unknown_compare_result;
}